

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_group_ops(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  long *plVar6;
  long lVar7;
  int *piVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 *puVar11;
  void **ppvVar12;
  _func_int ***ppp_Var13;
  int i;
  uint uVar14;
  pointer ppLVar15;
  Layer *pLVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  _func_int **pp_Var20;
  int iVar21;
  pointer ppLVar22;
  void *in_R8;
  Allocator *pAVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar40 [16];
  undefined1 in_ZMM11 [64];
  ParamDict pd;
  Mat local_2d8;
  undefined1 auStack_28c [8];
  int local_284;
  uint local_280;
  int local_27c;
  undefined1 local_278 [44];
  int iStack_24c;
  undefined8 uStack_248;
  int local_240 [2];
  size_t local_238;
  Allocator *local_230;
  int iStack_228;
  undefined4 uStack_224;
  int iStack_220;
  int iStack_21c;
  uint uStack_218;
  Allocator *local_210;
  undefined8 local_208;
  ulong uStack_200;
  uint local_1f8;
  size_t local_1f0;
  _func_int **local_1e8;
  int *piStack_1e0;
  long lStack_1d8;
  int iStack_1d0;
  Allocator *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  int local_1b0;
  size_t local_1a8;
  void *local_1a0;
  int *piStack_198;
  long lStack_190;
  undefined4 uStack_188;
  long *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined8 local_160;
  void *local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  long *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined8 local_118;
  Mat local_108;
  undefined8 *local_b8;
  void **local_b0;
  undefined8 *local_a8;
  _func_int ***local_a0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_98;
  size_t local_90;
  Allocator *local_88;
  long local_80;
  ParamDict local_78;
  size_t local_68;
  undefined1 *local_60;
  size_t local_58;
  Option *local_50;
  undefined1 local_48 [16];
  
  ppLVar22 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar21 = *(int *)(&this->field_0xd8 + (long)p_Var5) * *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var5);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var5);
  uVar18 = (long)*(int *)(&this->field_0x104 + (long)p_Var5) / (long)iVar3;
  uVar18 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) / (long)iVar21;
  ppLVar15 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_50 = opt;
  if (0 < (int)((ulong)((long)ppLVar15 - (long)ppLVar22) >> 3)) {
    lVar24 = 0;
    do {
      if (ppLVar22[lVar24] != (Layer *)0x0) {
        (*ppLVar22[lVar24]->_vptr_Layer[1])();
      }
      lVar24 = lVar24 + 1;
      ppLVar22 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar15 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar24 < (int)((ulong)((long)ppLVar15 - (long)ppLVar22) >> 3));
  }
  local_98 = &this->group_ops;
  if (ppLVar15 != ppLVar22) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar22;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_98,(long)iVar4);
  pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
  if (0 < *(int *)(&this->field_0x108 + (long)pp_Var20[-3])) {
    local_60 = &this->field_0x118;
    local_27c = iVar21 * i *
                (((int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_58 = (size_t)local_27c;
    local_68 = (size_t)i;
    local_a0 = &local_1e8;
    local_a8 = &local_1c0;
    local_b0 = &local_1a0;
    local_b8 = (undefined8 *)&local_178;
    local_48._8_8_ = 0x8000000000000000;
    local_48._0_8_ = 0x8000000000000000;
    lVar24 = 0;
    do {
      auVar40 = in_ZMM11._0_16_;
      auVar28 = in_ZMM10._0_16_;
      p_Var5 = pp_Var20[-3];
      lVar17 = *(long *)(&this->field_0x178 + (long)p_Var5);
      local_278._0_8_ = lVar24 * local_58 * lVar17 + *(long *)(&this->field_0x168 + (long)p_Var5);
      local_278._24_4_ = *(undefined4 *)(&this->field_0x180 + (long)p_Var5);
      local_278._32_8_ = *(undefined8 *)(&this->field_0x188 + (long)p_Var5);
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = (undefined4)lVar17;
      local_278._20_4_ = (undefined4)((ulong)lVar17 >> 0x20);
      iStack_24c = (int)local_58;
      local_278._40_4_ = 1;
      uStack_248._0_4_ = 1;
      uStack_248._4_4_ = 1;
      local_240[0] = 1;
      local_238 = local_58;
      Mat::clone(&local_108,(__fn *)local_278,(void *)0x0,1,in_R8);
      piVar8 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
            if ((void *)local_278._0_8_ != (void *)0x0) {
              free((void *)local_278._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_278._32_8_)[3])();
          }
        }
      }
      local_238 = 0;
      local_278._0_8_ = (void *)0x0;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = 0;
      local_278._20_4_ = 0;
      local_278._24_4_ = 0;
      stack0xfffffffffffffdb0 = ZEXT816(0);
      local_240[0] = 0;
      p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
      bVar25 = *(int *)(&this->field_0x100 + (long)p_Var5) == 0;
      if (bVar25) {
        pAVar23 = (Allocator *)0x0;
        local_80 = 0;
        local_280 = 0;
        local_88 = (Allocator *)0x0;
        local_284 = 0;
        local_90 = 0;
      }
      else {
        local_80 = *(long *)(&this->field_0x1c0 + (long)p_Var5);
        pAVar23 = (Allocator *)
                  (lVar24 * local_68 * local_80 + *(long *)(&this->field_0x1b0 + (long)p_Var5));
        local_280 = *(uint *)(&this->field_0x1c8 + (long)p_Var5);
        local_88 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var5);
        local_90 = local_68;
        local_284 = i;
      }
      bVar25 = !bVar25;
      pLVar16 = create_layer(6);
      ParamDict::ParamDict(&local_78);
      ParamDict::set(&local_78,0,i);
      ParamDict::set(&local_78,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_78,4,0);
      ParamDict::set(&local_78,0xe,0);
      ParamDict::set(&local_78,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_78,6,local_27c);
      ParamDict::set(&local_78,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_78,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_78,10,
                     (Mat *)(local_60 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      (*pLVar16->_vptr_Layer[2])(pLVar16,&local_78);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) == 0) {
        lVar17 = 0x40;
        auVar27._0_12_ = ZEXT812(0);
        auVar27._12_4_ = 0;
        do {
          *(undefined8 *)(local_278 + lVar17) = 0;
          *(undefined1 (*) [16])((long)&local_2d8.allocator + lVar17) = auVar27;
          *(undefined1 (*) [16])((long)&local_2d8.w + lVar17) = auVar27;
          *(undefined1 (*) [16])((long)&local_2d8.cstep + lVar17) = auVar27;
          *(undefined1 (*) [16])(auStack_28c + lVar17) = auVar27;
          lVar17 = lVar17 + 0x48;
        } while (lVar17 != 0x160);
        piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
              if ((void *)local_278._0_8_ != (void *)0x0) {
                free((void *)local_278._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_278._32_8_)[3])();
            }
          }
        }
        local_278._0_8_ = local_108.data;
        local_278._8_4_ = local_108.refcount._0_4_;
        local_278._12_4_ = local_108.refcount._4_4_;
        local_278._16_4_ = (undefined4)local_108.elemsize;
        local_278._20_4_ = local_108.elemsize._4_4_;
        local_278._24_4_ = local_108.elempack;
        local_278._32_8_ = local_108.allocator;
        uStack_248._0_4_ = local_108.h;
        uStack_248._4_4_ = local_108.d;
        local_278._40_4_ = local_108.dims;
        iStack_24c = local_108.w;
        local_240[0] = local_108.c;
        local_238 = local_108.cstep;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) != 0)
        {
          local_2d8.cstep = 0;
          local_2d8.data = (Allocator *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.elemsize._4_4_ = (int)local_2d8.refcount;
          local_2d8.allocator = (Allocator *)local_2d8.data;
          local_2d8.dims = (int)local_2d8.refcount;
          local_2d8.w = local_2d8.elempack;
          local_2d8.h = (int)local_2d8.elemsize;
          local_2d8.d = (int)local_2d8.refcount;
          local_2d8.c = local_2d8.elempack;
          Mat::create(&local_2d8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_0059f020;
          auVar9 = _DAT_0059f000;
          uVar14 = local_2d8.c * (int)local_2d8.cstep;
          auVar28 = vpcmpeqd_avx(auVar28,auVar28);
          if (0 < (int)uVar14) {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = (ulong)uVar14 - 1;
            auVar27 = vpshufd_avx(auVar29,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) + lVar24 * 4);
            auVar31._4_4_ = uVar1;
            auVar31._0_4_ = uVar1;
            auVar31._8_4_ = uVar1;
            auVar31._12_4_ = uVar1;
            auVar31._16_4_ = uVar1;
            auVar31._20_4_ = uVar1;
            auVar31._24_4_ = uVar1;
            auVar31._28_4_ = uVar1;
            uVar18 = 0;
            do {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar18;
              auVar29 = vpshufd_avx(auVar33,0x44);
              auVar36._16_16_ = auVar29;
              auVar36._0_16_ = auVar29;
              auVar37 = vorps_avx(auVar36,auVar9);
              auVar36 = vorps_avx(auVar10,auVar36);
              auVar29 = vpcmpgtq_avx(local_48 ^ auVar36._16_16_,local_48 ^ auVar27);
              auVar33 = vpcmpgtq_avx(local_48 ^ auVar36._0_16_,local_48 ^ auVar27);
              auVar29 = vpackssdw_avx(auVar33,auVar29);
              auVar33 = vpcmpgtq_avx(local_48 ^ auVar37._16_16_,local_48 ^ auVar27);
              auVar39._0_4_ = local_48._0_4_ ^ auVar37._0_4_;
              auVar39._4_4_ = local_48._4_4_ ^ auVar37._4_4_;
              auVar39._8_4_ = local_48._8_4_ ^ auVar37._8_4_;
              auVar39._12_4_ = local_48._12_4_ ^ auVar37._12_4_;
              auVar39 = vpcmpgtq_avx(auVar39,local_48 ^ auVar27);
              auVar33 = vpackssdw_avx(auVar39,auVar33);
              auVar29 = vpackssdw_avx(auVar28 ^ auVar33,auVar28 ^ auVar29);
              auVar33 = vpmovsxwd_avx(auVar29);
              auVar29 = vpunpckhwd_avx(auVar29,auVar29);
              auVar37._16_16_ = auVar29;
              auVar37._0_16_ = auVar33;
              auVar37 = vmaskmovps_avx(auVar37,auVar31);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2d8.data + uVar18 * 4) = auVar37;
              uVar18 = uVar18 + 8;
            } while ((uVar14 + 7 & 0xfffffff8) != uVar18);
          }
          piVar8 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          piVar8 = (int *)CONCAT44(uStack_224,iStack_228);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_210 == (Allocator *)0x0) {
                if (local_230 != (Allocator *)0x0) {
                  free(local_230);
                }
              }
              else {
                (*local_210->_vptr_Allocator[3])();
              }
            }
          }
          local_230 = (Allocator *)local_2d8.data;
          iStack_228 = (int)local_2d8.refcount;
          uStack_224 = local_2d8.refcount._4_4_;
          iStack_220 = (int)local_2d8.elemsize;
          iStack_21c = local_2d8.elemsize._4_4_;
          uStack_218 = local_2d8.elempack;
          local_210 = local_2d8.allocator;
          local_208 = CONCAT44(local_2d8.w,local_2d8.dims);
          uStack_200 = CONCAT44(local_2d8.d,local_2d8.h);
          local_1f8 = local_2d8.c;
          local_1f0 = local_2d8.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          lVar17 = *(long *)(&this->field_0x250 + (long)p_Var5);
          pp_Var20 = (_func_int **)(lVar17 * lVar24 + *(long *)(&this->field_0x240 + (long)p_Var5));
          iVar2 = *(int *)(&this->field_0x258 + (long)p_Var5);
          pAVar23 = *(Allocator **)(&this->field_0x260 + (long)p_Var5);
          if (piStack_1e0 != (int *)0x0) {
            LOCK();
            *piStack_1e0 = *piStack_1e0 + -1;
            UNLOCK();
            if (*piStack_1e0 == 0) {
              if (local_1c8 == (Allocator *)0x0) {
                if (local_1e8 != (_func_int **)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (*local_1c8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var13 = local_a0;
          *(undefined8 *)((long)local_a0 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var13 + 0x14) = 0;
          *ppp_Var13 = (_func_int **)0x0;
          ppp_Var13[1] = (_func_int **)0x0;
          puVar11 = local_a8;
          *local_a8 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_1e0 = (int *)0x0;
          local_1c0 = 0x100000001;
          uStack_1b8 = 0x100000001;
          local_1b0 = 1;
          local_1a8 = 1;
          piVar8 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1e8 = pp_Var20;
          lStack_1d8 = lVar17;
          iStack_1d0 = iVar2;
          local_1c8 = pAVar23;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2d8.data != (Allocator *)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
        }
        p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var5)) {
          lVar17 = *(long *)(&this->field_0x298 + (long)p_Var5);
          lVar7 = *(long *)(&this->field_0x288 + (long)p_Var5);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var5);
          plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var5);
          if (piStack_198 != (int *)0x0) {
            LOCK();
            *piStack_198 = *piStack_198 + -1;
            UNLOCK();
            if (*piStack_198 == 0) {
              if (local_180 == (long *)0x0) {
                if (local_1a0 != (void *)0x0) {
                  free(local_1a0);
                }
              }
              else {
                (**(code **)(*local_180 + 0x18))();
              }
            }
          }
          ppvVar12 = local_b0;
          *(undefined8 *)((long)local_b0 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar12 + 0x14) = 0;
          *ppvVar12 = (void *)0x0;
          ppvVar12[1] = (void *)0x0;
          puVar11 = local_b8;
          *local_b8 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_198 = (int *)0x0;
          local_178 = 1;
          uStack_174 = 1;
          uStack_170 = 1;
          uStack_16c = 1;
          local_168 = 1;
          local_160 = 1;
          local_1a0 = (void *)(lVar17 * lVar24 + lVar7);
          lStack_190 = lVar17;
          uStack_188 = uVar1;
          local_180 = plVar6;
        }
        in_ZMM10 = ZEXT1664(auVar28);
        in_ZMM11 = ZEXT1664(auVar40);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2d8,(Mat *)local_278);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_2d8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2d8);
        lVar17 = 0xd8;
        do {
          piVar8 = *(int **)(local_278 + lVar17 + 8);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (*(long **)(local_278 + lVar17 + 0x20) == (long *)0x0) {
                if (*(void **)(local_278 + lVar17) != (void *)0x0) {
                  free(*(void **)(local_278 + lVar17));
                }
              }
              else {
                (**(code **)(**(long **)(local_278 + lVar17 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238 + lVar17) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0xc) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0x14) = 0;
          *(undefined8 *)(local_278 + lVar17) = 0;
          *(undefined8 *)(local_278 + lVar17 + 8) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0x28) = 0;
          *(undefined8 *)((long)local_240 + lVar17 + -8) = 0;
          *(undefined4 *)((long)local_240 + lVar17) = 0;
          lVar17 = lVar17 + -0x48;
        } while (lVar17 != -0x48);
      }
      else {
        lVar17 = 0x40;
        auVar26._0_12_ = ZEXT812(0);
        auVar26._12_4_ = 0;
        do {
          *(undefined8 *)(local_278 + lVar17) = 0;
          *(undefined1 (*) [16])((long)&local_2d8.allocator + lVar17) = auVar26;
          *(undefined1 (*) [16])((long)&local_2d8.w + lVar17) = auVar26;
          *(undefined1 (*) [16])((long)&local_2d8.cstep + lVar17) = auVar26;
          *(undefined1 (*) [16])(auStack_28c + lVar17) = auVar26;
          lVar17 = lVar17 + 0x48;
        } while (lVar17 != 0x1a8);
        piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
              if ((void *)local_278._0_8_ != (void *)0x0) {
                free((void *)local_278._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_278._32_8_)[3])();
            }
          }
        }
        local_278._0_8_ = local_108.data;
        local_278._8_4_ = local_108.refcount._0_4_;
        local_278._12_4_ = local_108.refcount._4_4_;
        local_278._16_4_ = (undefined4)local_108.elemsize;
        local_278._20_4_ = local_108.elemsize._4_4_;
        local_278._24_4_ = local_108.elempack;
        local_278._32_8_ = local_108.allocator;
        uStack_248._0_4_ = local_108.h;
        uStack_248._4_4_ = local_108.d;
        local_278._40_4_ = local_108.dims;
        iStack_24c = local_108.w;
        local_240[0] = local_108.c;
        local_238 = local_108.cstep;
        piVar8 = (int *)CONCAT44(uStack_224,iStack_228);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_210 == (Allocator *)0x0) {
              if (local_230 != (Allocator *)0x0) {
                free(local_230);
              }
            }
            else {
              (*local_210->_vptr_Allocator[3])();
            }
          }
        }
        iStack_228 = 0;
        uStack_224 = 0;
        iStack_220 = (int)local_80;
        iStack_21c = (int)((ulong)local_80 >> 0x20);
        uStack_218 = local_280;
        local_210 = local_88;
        local_1f8 = (uint)bVar25;
        local_208 = CONCAT44(local_284,local_1f8);
        uStack_200 = (ulong)CONCAT14(bVar25,local_1f8);
        local_1f0 = local_90;
        local_230 = pAVar23;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) != 0)
        {
          local_2d8.cstep = 0;
          local_2d8.data = (_func_int **)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
          local_2d8.allocator = (Allocator *)0x0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          Mat::create(&local_2d8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_0059f020;
          auVar9 = _DAT_0059f000;
          uVar14 = local_2d8.c * (int)local_2d8.cstep;
          auVar40 = vpcmpeqd_avx(auVar40,auVar40);
          if (0 < (int)uVar14) {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = (ulong)uVar14 - 1;
            auVar28 = vpshufd_avx(auVar28,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) + lVar24 * 4);
            auVar30._4_4_ = uVar1;
            auVar30._0_4_ = uVar1;
            auVar30._8_4_ = uVar1;
            auVar30._12_4_ = uVar1;
            auVar30._16_4_ = uVar1;
            auVar30._20_4_ = uVar1;
            auVar30._24_4_ = uVar1;
            auVar30._28_4_ = uVar1;
            uVar18 = 0;
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar18;
              auVar27 = vpshufd_avx(auVar32,0x44);
              auVar34._16_16_ = auVar27;
              auVar34._0_16_ = auVar27;
              auVar31 = vorps_avx(auVar9,auVar34);
              auVar37 = vorps_avx(auVar10,auVar34);
              auVar27 = vpcmpgtq_avx(local_48 ^ auVar37._16_16_,local_48 ^ auVar28);
              auVar29 = vpcmpgtq_avx(local_48 ^ auVar37._0_16_,local_48 ^ auVar28);
              auVar27 = vpackssdw_avx(auVar29,auVar27);
              auVar29 = vpcmpgtq_avx(local_48 ^ auVar31._16_16_,local_48 ^ auVar28);
              auVar38._0_4_ = local_48._0_4_ ^ auVar31._0_4_;
              auVar38._4_4_ = local_48._4_4_ ^ auVar31._4_4_;
              auVar38._8_4_ = local_48._8_4_ ^ auVar31._8_4_;
              auVar38._12_4_ = local_48._12_4_ ^ auVar31._12_4_;
              auVar33 = vpcmpgtq_avx(auVar38,local_48 ^ auVar28);
              auVar29 = vpackssdw_avx(auVar33,auVar29);
              auVar27 = vpackssdw_avx(auVar40 ^ auVar29,auVar40 ^ auVar27);
              auVar29 = vpmovsxwd_avx(auVar27);
              auVar27 = vpunpckhwd_avx(auVar27,auVar27);
              auVar35._16_16_ = auVar27;
              auVar35._0_16_ = auVar29;
              auVar31 = vmaskmovps_avx(auVar35,auVar30);
              *(undefined1 (*) [32])((long)local_2d8.data + uVar18 * 4) = auVar31;
              uVar18 = uVar18 + 8;
            } while ((uVar14 + 7 & 0xfffffff8) != uVar18);
          }
          piVar8 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          auVar28 = local_48;
          if (piStack_1e0 != (int *)0x0) {
            LOCK();
            *piStack_1e0 = *piStack_1e0 + -1;
            UNLOCK();
            if (*piStack_1e0 == 0) {
              if (local_1c8 == (Allocator *)0x0) {
                if (local_1e8 != (_func_int **)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (*local_1c8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var13 = local_a0;
          *(undefined8 *)((long)local_a0 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var13 + 0x14) = 0;
          *ppp_Var13 = (_func_int **)0x0;
          ppp_Var13[1] = (_func_int **)0x0;
          puVar11 = local_a8;
          *local_a8 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_1e0 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1e8 = (_func_int **)local_2d8.data;
          lStack_1d8 = CONCAT44(local_2d8.elemsize._4_4_,(int)local_2d8.elemsize);
          iStack_1d0 = local_2d8.elempack;
          local_1c8 = local_2d8.allocator;
          local_1c0 = CONCAT44(local_2d8.w,local_2d8.dims);
          uStack_1b8 = CONCAT44(local_2d8.d,local_2d8.h);
          local_1b0 = local_2d8.c;
          local_1a8 = local_2d8.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          lVar17 = *(long *)(&this->field_0x250 + (long)p_Var5);
          pvVar19 = (void *)(lVar17 * lVar24 + *(long *)(&this->field_0x240 + (long)p_Var5));
          uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var5);
          plVar6 = *(long **)(&this->field_0x260 + (long)p_Var5);
          if (piStack_198 != (int *)0x0) {
            LOCK();
            *piStack_198 = *piStack_198 + -1;
            UNLOCK();
            if (*piStack_198 == 0) {
              if (local_180 == (long *)0x0) {
                if (local_1a0 != (void *)0x0) {
                  free(local_1a0);
                }
              }
              else {
                (**(code **)(*local_180 + 0x18))();
              }
            }
          }
          ppvVar12 = local_b0;
          *(undefined8 *)((long)local_b0 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar12 + 0x14) = 0;
          *ppvVar12 = (void *)0x0;
          ppvVar12[1] = (void *)0x0;
          puVar11 = local_b8;
          *local_b8 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_198 = (int *)0x0;
          local_178 = 1;
          uStack_174 = 1;
          uStack_170 = 1;
          uStack_16c = 1;
          local_168 = 1;
          local_160 = 1;
          piVar8 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1a0 = pvVar19;
          lStack_190 = lVar17;
          uStack_188 = uVar1;
          local_180 = plVar6;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if ((_func_int **)local_2d8.data != (_func_int **)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
        }
        p_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var5)) {
          lVar17 = *(long *)(&this->field_0x298 + (long)p_Var5);
          lVar7 = *(long *)(&this->field_0x288 + (long)p_Var5);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var5);
          plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var5);
          piVar8 = (int *)CONCAT44(uStack_14c,uStack_150);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_138 == (long *)0x0) {
                if (local_158 != (void *)0x0) {
                  free(local_158);
                }
              }
              else {
                (**(code **)(*local_138 + 0x18))();
              }
            }
          }
          uStack_150 = 0;
          uStack_14c = 0;
          uStack_148 = (undefined4)lVar17;
          uStack_144 = (undefined4)((ulong)lVar17 >> 0x20);
          local_130 = 0x100000001;
          uStack_128 = 0x100000001;
          local_120 = 1;
          local_118 = 1;
          local_158 = (void *)(lVar17 * lVar24 + lVar7);
          uStack_140 = uVar1;
          local_138 = plVar6;
        }
        in_ZMM10 = ZEXT1664(auVar28);
        in_ZMM11 = ZEXT1664(auVar40);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2d8,(Mat *)local_278);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_2d8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2d8);
        lVar17 = 0x120;
        do {
          piVar8 = *(int **)(local_278 + lVar17 + 8);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (*(long **)(local_278 + lVar17 + 0x20) == (long *)0x0) {
                if (*(void **)(local_278 + lVar17) != (void *)0x0) {
                  free(*(void **)(local_278 + lVar17));
                }
              }
              else {
                (**(code **)(**(long **)(local_278 + lVar17 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238 + lVar17) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0xc) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0x14) = 0;
          *(undefined8 *)(local_278 + lVar17) = 0;
          *(undefined8 *)(local_278 + lVar17 + 8) = 0;
          *(undefined8 *)(local_278 + lVar17 + 0x28) = 0;
          *(undefined8 *)((long)local_240 + lVar17 + -8) = 0;
          *(undefined4 *)((long)local_240 + lVar17) = 0;
          lVar17 = lVar17 + -0x48;
        } while (lVar17 != -0x48);
      }
      (*pLVar16->_vptr_Layer[4])(pLVar16,local_50);
      (local_98->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar24] = pLVar16;
      ParamDict::~ParamDict(&local_78);
      piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      lVar24 = lVar24 + 1;
      pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
    } while (lVar24 < *(int *)(&this->field_0x108 + (long)pp_Var20[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}